

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int balloc(bstring b,int olen)

{
  uchar *local_28;
  uchar *x;
  int len;
  int olen_local;
  bstring b_local;
  
  if (((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) ||
      ((b->mlen < 1 || (b->mlen < b->slen)))) || (olen < 1)) {
    b_local._4_4_ = -1;
  }
  else {
    if (b->mlen <= olen) {
      x._0_4_ = snapUpSize(olen);
      if ((int)x <= b->mlen) {
        return 0;
      }
      if ((b->mlen * 7 < b->slen * 8) ||
         (local_28 = (uchar *)malloc((long)(int)x + 1), local_28 == (uchar *)0x0)) {
        local_28 = (uchar *)realloc(b->data,(long)(int)x + 1);
        if ((local_28 == (uchar *)0x0) &&
           (local_28 = (uchar *)realloc(b->data,(long)olen + 1), x._0_4_ = olen,
           local_28 == (uchar *)0x0)) {
          return -1;
        }
      }
      else {
        if (b->slen != 0) {
          memcpy(local_28,b->data,(long)b->slen);
        }
        free(b->data);
      }
      b->data = local_28;
      b->mlen = (int)x;
      b->data[b->slen] = '\0';
    }
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int balloc (bstring b, int olen) {
	int len;
	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen <= 0 ||
	    b->mlen < b->slen || olen <= 0) {
		return BSTR_ERR;
	}

	if (olen >= b->mlen) {
		unsigned char * x;

		if ((len = snapUpSize (olen)) <= b->mlen) return BSTR_OK;

		/* Assume probability of a non-moving realloc is 0.125 */
		if (7 * b->mlen < 8 * b->slen) {

			/* If slen is close to mlen in size then use realloc to reduce
			   the memory defragmentation */

			reallocStrategy:;

			x = (unsigned char *) bstr__realloc (b->data, (size_t) len + 1);
			if (x == NULL) {

				/* Since we failed, try allocating the tighest possible
				   allocation */

				len = olen;
				x = (unsigned char *) bstr__realloc (b->data, (size_t) len + 1);
				if (NULL == x) {
					return BSTR_ERR;
				}
			}
		} else {

			/* If slen is not close to mlen then avoid the penalty of copying
			   the extra bytes that are allocated, but not considered part of
			   the string */

			if (NULL == (x = (unsigned char *) bstr__alloc ((size_t) len + 1))) {

				/* Perhaps there is no available memory for the two
				   allocations to be in memory at once */

				goto reallocStrategy;

			} else {
				if (b->slen) bstr__memcpy ((char *) x, (char *) b->data,
				                           (size_t) b->slen);
				bstr__free (b->data);
			}
		}
		b->data = x;
		b->mlen = len;
		b->data[b->slen] = (unsigned char) '\0';

#if defined (BSTRLIB_TEST_CANARY)
		if (len > b->slen + 1) {
			memchr (b->data + b->slen + 1, 'X', len - (b->slen + 1));
		}
#endif
	}

	return BSTR_OK;
}